

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O2

uint64_t __thiscall
bloaty::RangeMap::
TranslateWithEntry<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter,
          uint64_t addr)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  
  bVar1 = EntryContains<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (this,iter,addr);
  if (bVar1) {
    if (iter._M_node[2]._M_left != (_Base_ptr)0xffffffffffffffff) {
      return (addr - *(long *)(iter._M_node + 1)) + (long)iter._M_node[2]._M_left;
    }
    __assertion = "iter->second.HasTranslation()";
    __line = 0x1a;
  }
  else {
    __assertion = "EntryContains(iter, addr)";
    __line = 0x19;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                ,__line,
                "uint64_t bloaty::RangeMap::TranslateWithEntry(T, uint64_t) const [T = std::_Rb_tree_const_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
               );
}

Assistant:

uint64_t RangeMap::TranslateWithEntry(T iter, uint64_t addr) const {
  assert(EntryContains(iter, addr));
  assert(iter->second.HasTranslation());
  return addr - iter->first + iter->second.other_start;
}